

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O3

void pelelm_derRhoY(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,
                   Geometry *param_6,Real param_7,int *param_8,int param_9)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  bool bVar25;
  double *local_88;
  
  iVar2 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar3 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar4 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar5 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar22 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
  lVar19 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1);
  lVar24 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1);
  iVar6 = (bx->smallend).vect[0];
  iVar7 = (bx->smallend).vect[1];
  local_88 = (derfab->super_BaseFab<double>).dptr + ((long)iVar6 - (long)iVar3);
  lVar1 = (long)iVar7 * 8;
  iVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar8 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  pdVar14 = (datfab->super_BaseFab<double>).dptr + ((long)iVar6 - (long)iVar2);
  iVar9 = (datfab->super_BaseFab<double>).domain.bigend.vect[2];
  lVar15 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar13 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar3) + 1);
  iVar2 = (bx->smallend).vect[2];
  iVar10 = (bx->bigend).vect[0];
  iVar11 = (bx->bigend).vect[1];
  iVar12 = (bx->bigend).vect[2];
  lVar18 = 0;
  do {
    iVar21 = iVar2;
    if (iVar2 <= iVar12) {
      do {
        if (iVar7 <= iVar11) {
          pdVar23 = (double *)
                    (((dcomp * lVar24 * 8 + (long)iVar5 * -8 + (long)iVar21 * 8) * lVar19 +
                     lVar1 + (long)iVar4 * -8) * lVar22 + (long)local_88);
          pdVar16 = (double *)
                    ((((long)iVar21 - (long)iVar8) * lVar13 * 8 + lVar1 + (long)iVar3 * -8) * lVar15
                    + (long)pdVar14);
          lVar17 = (long)iVar7;
          do {
            if (iVar6 <= iVar10) {
              lVar20 = 0;
              do {
                pdVar23[lVar20] = pdVar16[lVar20];
                lVar20 = lVar20 + 1;
              } while ((iVar10 - iVar6) + 1 != (int)lVar20);
            }
            lVar17 = lVar17 + 1;
            pdVar23 = pdVar23 + lVar22;
            pdVar16 = pdVar16 + lVar15;
          } while (iVar11 + 1 != (int)lVar17);
        }
        bVar25 = iVar21 != iVar12;
        iVar21 = iVar21 + 1;
      } while (bVar25);
    }
    lVar18 = lVar18 + 1;
    local_88 = local_88 + lVar19 * lVar22 * lVar24;
    pdVar14 = pdVar14 + lVar13 * lVar15 * (long)((iVar9 - iVar8) + 1);
  } while (lVar18 != 9);
  return;
}

Assistant:

void pelelm_derRhoY (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                  const FArrayBox& datfab, const Geometry& /*geomdata*/,
                  Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= NUM_SPECIES);
    AMREX_ASSERT(ncomp == NUM_SPECIES);
    auto const in_dat = datfab.array();
    auto          der = derfab.array(dcomp);
    amrex::ParallelFor(bx, NUM_SPECIES,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        der(i,j,k,n) = in_dat(i,j,k,n);
    });
}